

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O0

void __thiscall
QPDF::updateObjectMaps
          (QPDF *this,ObjUser *first_ou,QPDFObjectHandle *first_oh,
          function<int_(QPDFObjectHandle_&)> *skip_stream_parameters)

{
  bool bVar1;
  reference pvVar2;
  pointer pMVar3;
  mapped_type *this_00;
  mapped_type *this_01;
  reference __args_1;
  type __args;
  bool local_202;
  bool local_201;
  QPDFObjectHandle local_200;
  int local_1ec;
  unique_ptr<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_> local_1e8;
  BaseHandle *local_1e0;
  type *value;
  type *key;
  _Self local_1c8;
  iterator __end4;
  iterator __begin4;
  Dictionary *__range4;
  int local_190;
  undefined1 local_189;
  int ssp;
  bool is_stream;
  QPDFObjectHandle dict;
  QPDFObjectHandle *item;
  iterator __end3;
  iterator __begin3;
  Array *__range3;
  QPDFObjGen local_110;
  QPDFObjGen og;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  byte local_b1;
  undefined1 auStack_b0 [7];
  bool is_page_node;
  value_type cur;
  unique_ptr<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_> thumb_ou;
  bool local_71;
  undefined1 local_70 [8];
  vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_> pending;
  set visited;
  function<int_(QPDFObjectHandle_&)> *skip_stream_parameters_local;
  QPDFObjectHandle *first_oh_local;
  ObjUser *first_ou_local;
  QPDF *this_local;
  
  QPDFObjGen::set::set
            ((set *)&pending.
                     super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>::vector
            ((vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_> *)
             local_70);
  local_71 = true;
  std::vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>::
  emplace_back<QPDF::ObjUser_const&,QPDFObjectHandle&,bool>
            ((vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>> *)
             local_70,first_ou,first_oh,&local_71);
  std::unique_ptr<QPDF::ObjUser,std::default_delete<QPDF::ObjUser>>::
  unique_ptr<std::default_delete<QPDF::ObjUser>,void>
            ((unique_ptr<QPDF::ObjUser,std::default_delete<QPDF::ObjUser>> *)&cur.top);
  do {
    bVar1 = std::vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>::
            empty((vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
                   *)local_70);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::unique_ptr<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_>::~unique_ptr
                ((unique_ptr<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_> *)&cur.top);
      std::vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>::
      ~vector((vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_> *)
              local_70);
      QPDFObjGen::set::~set
                ((set *)&pending.
                         super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    pvVar2 = std::vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
             ::back((vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
                     *)local_70);
    UpdateObjectMapsFrame::UpdateObjectMapsFrame((UpdateObjectMapsFrame *)auStack_b0,pvVar2);
    std::vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>::pop_back
              ((vector<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_> *)
               local_70);
    local_b1 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"/Page",&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"",(allocator<char> *)((long)&og.gen + 3));
    bVar1 = QPDFObjectHandle::isDictionaryOfType((QPDFObjectHandle *)&cur,&local_d8,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)((long)&og.gen + 3));
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    if ((bVar1) &&
       (local_b1 = 1,
       ((byte)cur.oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi & 1) == 0)) {
      og.obj = 2;
    }
    else {
      bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)&cur);
      if (bVar1) {
        local_110 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&cur);
        bVar1 = QPDFObjGen::set::add
                          ((set *)&pending.
                                   super__Vector_base<QPDF::UpdateObjectMapsFrame,_std::allocator<QPDF::UpdateObjectMapsFrame>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,local_110);
        if (!bVar1) {
          QTC::TC("qpdf","QPDF opt loop detected",0);
          og.obj = 2;
          goto LAB_0039fbf7;
        }
        pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        this_00 = std::
                  map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                  ::operator[](&pMVar3->obj_user_to_objects,_auStack_b0);
        std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::insert
                  (this_00,&local_110);
        pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        this_01 = std::
                  map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
                  ::operator[](&pMVar3->object_to_obj_users,&local_110);
        std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>::insert
                  (this_01,_auStack_b0);
      }
      bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&cur);
      if (bVar1) {
        QPDFObjectHandle::as_array((Array *)&__begin3,(QPDFObjectHandle *)&cur,any);
        __end3 = ::qpdf::Array::begin((Array *)&__begin3);
        item = (QPDFObjectHandle *)::qpdf::Array::end((Array *)&__begin3);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                           *)&item), bVar1) {
          __args_1 = __gnu_cxx::
                     __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                     ::operator*(&__end3);
          dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._7_1_ = 0;
          std::vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>::
          emplace_back<QPDF::ObjUser_const&,QPDFObjectHandle_const&,bool>
                    ((vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>
                      *)local_70,_auStack_b0,__args_1,
                     (bool *)((long)&dict.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi + 7));
          __gnu_cxx::
          __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
          ::operator++(&__end3);
        }
        og.obj = 4;
        ::qpdf::Array::~Array((Array *)&__begin3);
      }
      else {
        bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&cur);
        if ((bVar1) || (bVar1 = QPDFObjectHandle::isStream((QPDFObjectHandle *)&cur), bVar1)) {
          QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&ssp,(QPDFObjectHandle *)&cur);
          local_189 = QPDFObjectHandle::isStream((QPDFObjectHandle *)&cur);
          local_190 = 0;
          if ((bool)local_189) {
            QPDFObjectHandle::getDict((QPDFObjectHandle *)&__range4);
            QPDFObjectHandle::operator=((QPDFObjectHandle *)&ssp,(QPDFObjectHandle *)&__range4);
            QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range4);
            bVar1 = std::function::operator_cast_to_bool((function *)skip_stream_parameters);
            if (bVar1) {
              local_190 = std::function<int_(QPDFObjectHandle_&)>::operator()
                                    (skip_stream_parameters,(QPDFObjectHandle *)&cur);
            }
          }
          QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__begin4,(typed)&ssp);
          __end4 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin4);
          local_1c8._M_node =
               (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin4);
          while (bVar1 = std::operator!=(&__end4,&local_1c8), bVar1) {
            key = &std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                   ::operator*(&__end4)->first;
            value = (type *)std::get<0ul,std::__cxx11::string_const,QPDFObjectHandle>
                                      ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                        *)key);
            local_1e0 = &std::get<1ul,std::__cxx11::string_const,QPDFObjectHandle>
                                   ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                     *)key)->super_BaseHandle;
            bVar1 = ::qpdf::BaseHandle::null(local_1e0);
            if (!bVar1) {
              if (((local_b1 & 1) == 0) ||
                 (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)value,"/Thumb"), !bVar1)) {
                if (((((local_b1 & 1) == 0) ||
                     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)value,"/Parent"), !bVar1)) &&
                    ((local_190 < 1 ||
                     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)value,"/Length"), !bVar1)))) &&
                   ((local_190 < 2 ||
                    ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)value,"/Filter"), !bVar1 &&
                     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)value,"/DecodeParms"), !bVar1)))))) {
                  local_202 = false;
                  std::
                  vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>::
                  emplace_back<QPDF::ObjUser_const&,QPDFObjectHandle&,bool>
                            ((vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>
                              *)local_70,_auStack_b0,(QPDFObjectHandle *)local_1e0,&local_202);
                }
              }
              else {
                local_1ec = 2;
                std::make_unique<QPDF::ObjUser,QPDF::ObjUser::user_e,int_const&>
                          ((user_e *)&local_1e8,&local_1ec);
                std::unique_ptr<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_>::operator=
                          ((unique_ptr<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_> *)
                           &cur.top,&local_1e8);
                std::unique_ptr<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_>::~unique_ptr
                          (&local_1e8);
                __args = std::unique_ptr<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_>::
                         operator*((unique_ptr<QPDF::ObjUser,_std::default_delete<QPDF::ObjUser>_> *
                                   )&cur.top);
                QPDFObjectHandle::getKey(&local_200,(string *)&ssp);
                local_201 = false;
                std::vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>
                ::emplace_back<QPDF::ObjUser&,QPDFObjectHandle,bool>
                          ((vector<QPDF::UpdateObjectMapsFrame,std::allocator<QPDF::UpdateObjectMapsFrame>>
                            *)local_70,__args,&local_200,&local_201);
                QPDFObjectHandle::~QPDFObjectHandle(&local_200);
              }
            }
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
            ::operator++(&__end4);
          }
          og.obj = 6;
          ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin4);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&ssp);
        }
      }
      og.obj = 0;
    }
LAB_0039fbf7:
    UpdateObjectMapsFrame::~UpdateObjectMapsFrame((UpdateObjectMapsFrame *)auStack_b0);
  } while( true );
}

Assistant:

void
QPDF::updateObjectMaps(
    ObjUser const& first_ou,
    QPDFObjectHandle first_oh,
    std::function<int(QPDFObjectHandle&)> skip_stream_parameters)
{
    QPDFObjGen::set visited;
    std::vector<UpdateObjectMapsFrame> pending;
    pending.emplace_back(first_ou, first_oh, true);
    // Traverse the object tree from this point taking care to avoid crossing page boundaries.
    std::unique_ptr<ObjUser> thumb_ou;
    while (!pending.empty()) {
        auto cur = pending.back();
        pending.pop_back();

        bool is_page_node = false;

        if (cur.oh.isDictionaryOfType("/Page")) {
            is_page_node = true;
            if (!cur.top) {
                continue;
            }
        }

        if (cur.oh.isIndirect()) {
            QPDFObjGen og(cur.oh.getObjGen());
            if (!visited.add(og)) {
                QTC::TC("qpdf", "QPDF opt loop detected");
                continue;
            }
            m->obj_user_to_objects[cur.ou].insert(og);
            m->object_to_obj_users[og].insert(cur.ou);
        }

        if (cur.oh.isArray()) {
            for (auto const& item: cur.oh.as_array()) {
                pending.emplace_back(cur.ou, item, false);
            }
        } else if (cur.oh.isDictionary() || cur.oh.isStream()) {
            QPDFObjectHandle dict = cur.oh;
            bool is_stream = cur.oh.isStream();
            int ssp = 0;
            if (is_stream) {
                dict = cur.oh.getDict();
                if (skip_stream_parameters) {
                    ssp = skip_stream_parameters(cur.oh);
                }
            }

            for (auto& [key, value]: dict.as_dictionary()) {
                if (value.null()) {
                    continue;
                }

                if (is_page_node && (key == "/Thumb")) {
                    // Traverse page thumbnail dictionaries as a special case. There can only ever
                    // be one /Thumb key on a page, and we see at most one page node per call.
                    thumb_ou = std::make_unique<ObjUser>(ObjUser::ou_thumb, cur.ou.pageno);
                    pending.emplace_back(*thumb_ou, dict.getKey(key), false);
                } else if (is_page_node && (key == "/Parent")) {
                    // Don't traverse back up the page tree
                } else if (
                    ((ssp >= 1) && (key == "/Length")) ||
                    ((ssp >= 2) && ((key == "/Filter") || (key == "/DecodeParms")))) {
                    // Don't traverse into stream parameters that we are not going to write.
                } else {
                    pending.emplace_back(cur.ou, value, false);
                }
            }
        }
    }
}